

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageLevel.cpp
# Opt level: O2

DeepImageChannel * __thiscall
Imf_3_2::DeepImageLevel::findChannel(DeepImageLevel *this,string *name)

{
  iterator iVar1;
  DeepImageChannel *pDVar2;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::DeepImageChannel_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::DeepImageChannel_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::DeepImageChannel_*>_>_>
          ::find(&(this->_channels)._M_t,name);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->_channels)._M_t._M_impl.super__Rb_tree_header) {
    pDVar2 = (DeepImageChannel *)0x0;
  }
  else {
    pDVar2 = *(DeepImageChannel **)(iVar1._M_node + 2);
  }
  return pDVar2;
}

Assistant:

DeepImageChannel*
DeepImageLevel::findChannel (const string& name)
{
    ChannelMap::iterator i = _channels.find (name);

    if (i != _channels.end ())
        return i->second;
    else
        return 0;
}